

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_DACCtrl_Setup(VGMPlayer *this)

{
  byte bVar1;
  UINT8 UVar2;
  UINT16 Command;
  size_type sVar3;
  reference pvVar4;
  CHIP_DEVICE *devInf;
  byte chipType_00;
  CHIP_DEVICE *destChip;
  UINT16 chipCmd;
  UINT8 chipID;
  UINT8 chipType;
  DACSTRM_DEV *dacStrm;
  undefined1 auStack_58 [7];
  UINT8 retVal;
  DACSTRM_DEV dacStrm_1;
  DEV_GEN_CFG devCfg;
  size_t dsID;
  VGMPlayer *this_local;
  
  devCfg._8_8_ = this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]];
  if (devCfg._8_8_ == 0xffffffffffffffff) {
    if (this->_fileData[(ulong)this->_filePos + 1] == 0xff) {
      return;
    }
    dacStrm_1.streamID = '\0';
    dacStrm_1.bankID = '\0';
    dacStrm_1._42_2_ = 0;
    dacStrm_1._44_1_ = 0;
    dacStrm_1._45_1_ = 0;
    UVar2 = device_start_daccontrol((DEV_GEN_CFG *)&dacStrm_1.streamID,(DEV_INFO *)auStack_58);
    if (UVar2 != '\0') {
      return;
    }
    (**(code **)(dacStrm_1.defInf._8_8_ + 0x28))(_auStack_58);
    dacStrm_1.defInf.linkDevs._0_1_ = this->_fileData[(ulong)this->_filePos + 1];
    dacStrm_1.defInf.linkDevs._1_1_ = 0xff;
    sVar3 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::size
                      (&this->_dacStreams);
    this->_dacStrmMap[(byte)dacStrm_1.defInf.linkDevs] = sVar3;
    std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::push_back
              (&this->_dacStreams,(value_type *)auStack_58);
    devCfg._8_8_ = this->_dacStrmMap[(byte)dacStrm_1.defInf.linkDevs];
  }
  pvVar4 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::operator[]
                     (&this->_dacStreams,devCfg._8_8_);
  chipType_00 = this->_fileData[(ulong)this->_filePos + 2] & 0x7f;
  bVar1 = this->_fileData[(ulong)this->_filePos + 2];
  Command = ReadBE16(this->_fileData + (ulong)this->_filePos + 3);
  devInf = GetDevicePtr(this,chipType_00,(UINT8)((int)(bVar1 & 0x80) >> 7));
  if (devInf != (CHIP_DEVICE *)0x0) {
    daccontrol_setup_chip((pvVar4->defInf).dataPtr,(DEV_INFO *)devInf,chipType_00,Command);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_Setup(void)	// DAC Stream Control: Setup Chip
{
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
	{
		if (fData[0x01] == 0xFF)
			return;
		
		DEV_GEN_CFG devCfg;
		DACSTRM_DEV dacStrm;
		UINT8 retVal;
		
		devCfg.emuCore = 0x00;
		devCfg.srMode = DEVRI_SRMODE_NATIVE;
		devCfg.flags = 0x00;
		devCfg.clock = 0;
		devCfg.smplRate = _outSmplRate;
		retVal = device_start_daccontrol(&devCfg, &dacStrm.defInf);
		if (retVal)
			return;
		dacStrm.defInf.devDef->Reset(dacStrm.defInf.dataPtr);
		dacStrm.streamID = fData[0x01];
		dacStrm.bankID = 0xFF;
		
		_dacStrmMap[dacStrm.streamID] = _dacStreams.size();
		_dacStreams.push_back(dacStrm);
		
		dsID = _dacStrmMap[dacStrm.streamID];
	}
	
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	UINT8 chipType = fData[0x02] & 0x7F;
	UINT8 chipID = (fData[0x02] & 0x80) >> 7;
	UINT16 chipCmd = ReadBE16(&fData[0x03]);
	CHIP_DEVICE* destChip = GetDevicePtr(chipType, chipID);
	if (destChip == NULL)
		return;
	
	daccontrol_setup_chip(dacStrm->defInf.dataPtr, &destChip->base.defInf, chipType, chipCmd);
	return;
}